

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::AreSamePropertyDescriptors
               (PropertyDescriptor *x,PropertyDescriptor *y,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  Var pvVar6;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *y_local;
  PropertyDescriptor *x_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x269e,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = PropertyDescriptor::ConfigurableSpecified(x);
  bVar3 = PropertyDescriptor::ConfigurableSpecified(y);
  if (bVar2 == bVar3) {
    bVar2 = PropertyDescriptor::IsConfigurable(x);
    bVar3 = PropertyDescriptor::IsConfigurable(y);
    if (bVar2 == bVar3) {
      bVar2 = PropertyDescriptor::EnumerableSpecified(x);
      bVar3 = PropertyDescriptor::EnumerableSpecified(y);
      if (bVar2 == bVar3) {
        bVar2 = PropertyDescriptor::IsEnumerable(x);
        bVar3 = PropertyDescriptor::IsEnumerable(y);
        if (bVar2 == bVar3) {
          bVar2 = PropertyDescriptor::IsDataDescriptor(x);
          if (bVar2) {
            bVar2 = PropertyDescriptor::IsDataDescriptor(y);
            if (bVar2) {
              bVar2 = PropertyDescriptor::WritableSpecified(x);
              bVar3 = PropertyDescriptor::WritableSpecified(y);
              if (bVar2 == bVar3) {
                bVar2 = PropertyDescriptor::IsWritable(x);
                bVar3 = PropertyDescriptor::IsWritable(y);
                if (bVar2 == bVar3) {
                  bVar2 = PropertyDescriptor::ValueSpecified(x);
                  if (!bVar2) {
                    return true;
                  }
                  bVar2 = PropertyDescriptor::ValueSpecified(y);
                  if (bVar2) {
                    pvVar5 = PropertyDescriptor::GetValue(x);
                    pvVar6 = PropertyDescriptor::GetValue(y);
                    bVar2 = JavascriptConversion::SameValue(pvVar5,pvVar6);
                    if (bVar2) {
                      return true;
                    }
                  }
                  return false;
                }
              }
            }
            return false;
          }
          bVar2 = PropertyDescriptor::IsAccessorDescriptor(x);
          if (!bVar2) {
            return true;
          }
          bVar2 = PropertyDescriptor::IsAccessorDescriptor(y);
          if (!bVar2) {
            return false;
          }
          bVar2 = PropertyDescriptor::GetterSpecified(x);
          if (bVar2) {
            bVar2 = PropertyDescriptor::GetterSpecified(y);
            if (!bVar2) {
              return false;
            }
            pvVar5 = PropertyDescriptor::GetGetter(x);
            pvVar5 = CanonicalizeAccessor(pvVar5,scriptContext);
            pvVar6 = PropertyDescriptor::GetGetter(y);
            pvVar6 = CanonicalizeAccessor(pvVar6,scriptContext);
            bVar2 = JavascriptConversion::SameValue(pvVar5,pvVar6);
            if (!bVar2) {
              return false;
            }
          }
          bVar2 = PropertyDescriptor::SetterSpecified(x);
          if (!bVar2) {
            return true;
          }
          bVar2 = PropertyDescriptor::SetterSpecified(y);
          if (bVar2) {
            pvVar5 = PropertyDescriptor::GetSetter(x);
            pvVar5 = CanonicalizeAccessor(pvVar5,scriptContext);
            pvVar6 = PropertyDescriptor::GetSetter(y);
            pvVar6 = CanonicalizeAccessor(pvVar6,scriptContext);
            bVar2 = JavascriptConversion::SameValue(pvVar5,pvVar6);
            if (bVar2) {
              return true;
            }
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool JavascriptOperators::AreSamePropertyDescriptors(const PropertyDescriptor* x, const PropertyDescriptor* y, ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        if (x->ConfigurableSpecified() != y->ConfigurableSpecified() || x->IsConfigurable() != y->IsConfigurable() ||
            x->EnumerableSpecified() != y->EnumerableSpecified() || x->IsEnumerable() != y->IsEnumerable())
        {
            return false;
        }

        if (x->IsDataDescriptor())
        {
            if (!y->IsDataDescriptor() || x->WritableSpecified() != y->WritableSpecified() || x->IsWritable() != y->IsWritable())
            {
                return false;
            }

            if (x->ValueSpecified())
            {
                if (!y->ValueSpecified() || !JavascriptConversion::SameValue(x->GetValue(), y->GetValue()))
                {
                    return false;
                }
            }
        }
        else if (x->IsAccessorDescriptor())
        {
            if (!y->IsAccessorDescriptor())
            {
                return false;
            }

            if (x->GetterSpecified())
            {
                if (!y->GetterSpecified() || !JavascriptConversion::SameValue(
                    JavascriptOperators::CanonicalizeAccessor(x->GetGetter(), scriptContext),
                    JavascriptOperators::CanonicalizeAccessor(y->GetGetter(), scriptContext)))
                {
                    return false;
                }
            }

            if (x->SetterSpecified())
            {
                if (!y->SetterSpecified() || !JavascriptConversion::SameValue(
                    JavascriptOperators::CanonicalizeAccessor(x->GetSetter(), scriptContext),
                    JavascriptOperators::CanonicalizeAccessor(y->GetSetter(), scriptContext)))
                {
                    return false;
                }
            }
        }

        return true;
    }